

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fLayoutBindingTests.cpp
# Opt level: O1

string * deqp::gles31::Functional::anon_unknown_1::generateTessControlShader
                   (string *__return_storage_ptr__,ShaderType shaderType,
                   string *shaderUniformDeclarations,string *shaderBody)

{
  ostream *poVar1;
  char *pcVar2;
  char *pcVar3;
  ostringstream tessControlShaderSource;
  undefined1 auStack_198 [376];
  
  if (shaderType < SHADERTYPE_LAST) {
    if ((0xbU >> (shaderType & 0x1f) & 1) == 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_198);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)auStack_198,"#version 310 es\n",0x10);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)auStack_198,"#extension GL_EXT_tessellation_shader : require\n",0x30);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)auStack_198,"layout (vertices=3) out;\n",0x19);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_198,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)auStack_198,"uniform highp int u_arrayNdx;\n\n",0x1f);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)auStack_198,(shaderUniformDeclarations->_M_dataplus)._M_p,
                          shaderUniformDeclarations->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"void main (void)\n",0x11);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"{\n",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\thighp vec4 color;\n\n",0x14);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar1,(shaderBody->_M_dataplus)._M_p,shaderBody->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,
                 "\tgl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n",
                 0x4b);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"}\n",2);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_198);
      std::ios_base::~ios_base((ios_base *)(auStack_198 + 0x70));
      return __return_storage_ptr__;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = 
    "#version 310 es\n#extension GL_EXT_tessellation_shader : require\nlayout (vertices=3) out;\n\nvoid main (void)\n{\n\tgl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n}\n"
    ;
    pcVar2 = "";
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "";
    pcVar3 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string generateTessControlShader (ShaderType shaderType, const std::string& shaderUniformDeclarations, const std::string& shaderBody)
{
	static const char* const s_simpleTessContorlShaderSource =	"#version 310 es\n"
																"#extension GL_EXT_tessellation_shader : require\n"
																"layout (vertices=3) out;\n"
																"\n"
																"void main (void)\n"
																"{\n"
																"	gl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n"
																"}\n";

	switch (shaderType)
	{
		case SHADERTYPE_VERTEX:
		case SHADERTYPE_FRAGMENT:
		case SHADERTYPE_TESS_EVALUATION:
			return s_simpleTessContorlShaderSource;

		case SHADERTYPE_TESS_CONTROL:
		case SHADERTYPE_ALL:
		{
			std::ostringstream tessControlShaderSource;
			tessControlShaderSource <<	"#version 310 es\n"
									<<	"#extension GL_EXT_tessellation_shader : require\n"
									<<	"layout (vertices=3) out;\n"
									<<	"\n"
									<<	"uniform highp int u_arrayNdx;\n\n"
									<<	shaderUniformDeclarations << "\n"
									<<	"void main (void)\n"
									<<	"{\n"
									<<	"	highp vec4 color;\n\n"
									<<	shaderBody << "\n"
									<<	"	gl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n"
									<<	"}\n";

			return tessControlShaderSource.str();
		}

		default:
			DE_ASSERT(false);
			return "";
	}
}